

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  byte *pbVar1;
  short sVar2;
  ushort uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  parse_ctx *ppVar6;
  parse_ctx *ppVar7;
  token_t ptVar8;
  node_t pnVar9;
  node_t pnVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  node_t_conflict pnVar20;
  size_t sVar21;
  node_t_conflict pnVar22;
  node_t_conflict pnVar23;
  node_t_conflict pnVar24;
  char *pcVar25;
  node_t_conflict op;
  node_t_conflict op_00;
  ulong uVar26;
  anon_union_16_10_0af5b411_for_u *paVar27;
  undefined8 uVar28;
  ulong uVar29;
  ulong uVar30;
  node_t __s;
  parse_ctx_t parse_ctx;
  node_code_t nVar31;
  int iVar32;
  anon_union_16_10_0af5b411_for_u *paVar33;
  ulong uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  pos_t p;
  pos_t p_00;
  pos_t pVar37;
  
  ppVar6 = c2m_ctx->parse_ctx;
  pnVar20 = new_node(c2m_ctx,N_LIST);
  while( true ) {
    sVar21 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
    ppVar7 = c2m_ctx->parse_ctx;
    ptVar8 = ppVar7->curr_token;
    sVar2 = *(short *)ptVar8;
    if (sVar2 != 0x103) break;
    pnVar23 = ptVar8->node;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar22 = new_node(c2m_ctx,N_LABEL);
LAB_001992dd:
    op_append(c2m_ctx,pnVar22,pnVar23);
LAB_001992e2:
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3a) {
      if (ppVar7->record_level == 0) {
        pcVar25 = get_token_name(c2m_ctx,0x3a);
LAB_0019935c:
        syntax_error(c2m_ctx,pcVar25);
      }
      goto LAB_00199361;
    }
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    record_stop(c2m_ctx,sVar21,(uint)(pnVar22 == &err_struct));
    if (pnVar22 == &err_struct) goto LAB_00199371;
    op_append(c2m_ctx,pnVar20,pnVar22);
  }
  if (sVar2 == 0x120) {
    pVar37 = ptVar8->pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar22 = new_node(c2m_ctx,N_DEFAULT);
    add_pos(c2m_ctx,pnVar22,pVar37);
    goto LAB_001992e2;
  }
  if (sVar2 != 0x11c) {
    if (ppVar7->record_level != 0) goto LAB_00199361;
    pcVar25 = "identifier";
    goto LAB_0019935c;
  }
  pVar37 = ptVar8->pos;
  read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
  pnVar22 = right_op(c2m_ctx,1,0x2c,-1,assign_expr,expr);
  if (pnVar22 != &err_struct) {
    pnVar22 = new_pos_node1(c2m_ctx,N_CASE,pVar37,pnVar22);
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x10f) goto LAB_001992e2;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar23 = right_op(c2m_ctx,1,0x2c,-1,assign_expr,expr);
    if (pnVar23 != &err_struct) goto LAB_001992dd;
  }
LAB_00199361:
  record_stop(c2m_ctx,sVar21,1);
LAB_00199371:
  if (*(short *)ppVar6->curr_token == 0x7b) {
    pnVar22 = compound_stmt(c2m_ctx,no_err_p);
    if (pnVar22 == &err_struct) {
      return &err_struct;
    }
    if ((pnVar20->u).s.s == (char *)0x0) {
      return pnVar22;
    }
    pnVar9 = (pnVar22->u).ops.head;
    if ((pnVar9->code != N_LIST) || ((pnVar9->u).s.s != (char *)0x0)) {
      __assert_fail("NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x143a,"node_t stmt(c2m_ctx_t, int)");
    }
    pnVar10 = (pnVar9->op_link).prev;
    __s = (pnVar9->op_link).next;
    paVar27 = &pnVar22->u;
    paVar33 = (anon_union_16_10_0af5b411_for_u *)&(pnVar10->op_link).next;
    if (pnVar10 == (node_t)0x0) {
      paVar33 = paVar27;
    }
    (paVar33->ops).head = __s;
    if (__s == (node_t)0x0) {
      if ((node_t)(pnVar22->u).s.len == pnVar9) {
        (pnVar22->u).ops.tail = pnVar10;
        goto LAB_00199558;
      }
    }
    else {
      (__s->op_link).prev = pnVar10;
LAB_00199558:
      (pnVar9->op_link).prev = (node_t)0x0;
      (pnVar9->op_link).next = (node_t)0x0;
      pnVar9 = (paVar27->ops).head;
      if (pnVar9 == (node_t)0x0) {
        if ((pnVar22->u).s.len == 0) {
          (pnVar22->u).ops.tail = pnVar20;
          goto LAB_0019958c;
        }
        goto LAB_00199f2a;
      }
      if ((pnVar9->op_link).prev == (node_t)0x0) {
        (pnVar9->op_link).prev = pnVar20;
LAB_0019958c:
        (pnVar20->op_link).prev = (node_t)0x0;
        (pnVar20->op_link).next = pnVar9;
        (paVar27->ops).head = pnVar20;
        return pnVar22;
      }
      stmt_cold_2();
    }
    stmt_cold_1();
LAB_00199f2a:
    stmt_cold_3();
    uVar26 = strlen((char *)__s);
    uVar29 = uVar26 + 0x42;
    for (; 0xf < uVar26; uVar26 = uVar26 - 0x10) {
      uVar4 = __s->code;
      uVar11 = __s->uid;
      auVar17._4_4_ = uVar11;
      auVar17._0_4_ = uVar4;
      auVar17._8_8_ = 0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = __s->attr;
      __s = (node_t)&__s->op_link;
      uVar29 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar18,8) +
               SUB168(ZEXT816(0x288eea216831e6a7) * auVar18,0) ^
               SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar17,8) +
               SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar17,0) ^ uVar29;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar29;
      uVar29 = SUB168(auVar13 * ZEXT816(0x65862b62bdf5ef4d),8) +
               SUB168(auVar13 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar29;
    }
    if (7 < uVar26) {
      uVar26 = uVar26 - 8;
      uVar5 = __s->code;
      uVar12 = __s->uid;
      auVar19._4_4_ = uVar12;
      auVar19._0_4_ = uVar5;
      auVar19._8_8_ = 0;
      __s = (node_t)&__s->attr;
      uVar29 = uVar29 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar19,8) +
                        SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar19,0);
    }
    if (uVar26 != 0) {
      if (uVar26 < 4) {
        uVar34 = 0;
        uVar30 = 0;
      }
      else {
        uVar34 = 4;
        uVar30 = (ulong)__s->code << 0x20;
      }
      if (uVar34 < uVar26) {
        do {
          pbVar1 = (byte *)((long)&__s->code + uVar34);
          uVar34 = uVar34 + 1;
          uVar30 = uVar30 >> 8 | (ulong)*pbVar1 << 0x38;
        } while (uVar26 != uVar34);
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar30;
      uVar29 = uVar29 ^ SUB168(auVar14 * ZEXT816(0x288eea216831e6a7),8) +
                        SUB168(auVar14 * ZEXT816(0x288eea216831e6a7),0);
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar29;
    uVar29 = SUB168(auVar15 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar15 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar29;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar29;
    return (node_t_conflict)
           (ulong)((uint)uVar29 ^
                  SUB164(auVar16 * ZEXT816(0x288eea216831e6a7),8) +
                  SUB164(auVar16 * ZEXT816(0x288eea216831e6a7),0));
  }
  ptVar8 = c2m_ctx->parse_ctx->curr_token;
  uVar3 = *(ushort *)ptVar8;
  if (0x12e < uVar3) {
    if (uVar3 != 0x12f) {
      if (uVar3 == 0x135) {
        pcVar25 = (ptVar8->pos).fname;
        uVar28._0_4_ = (ptVar8->pos).lno;
        uVar28._4_4_ = (ptVar8->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
          if (pnVar22 == &err_struct) {
            return &err_struct;
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            pnVar23 = stmt(c2m_ctx,no_err_p);
            if (pnVar23 == &err_struct) {
              return &err_struct;
            }
            nVar31 = N_SWITCH;
LAB_00199a69:
            p_00.lno = (int)uVar28;
            p_00.ln_pos = (int)((ulong)uVar28 >> 0x20);
            p_00.fname = pcVar25;
            pnVar20 = new_pos_node3(c2m_ctx,nVar31,p_00,pnVar20,pnVar22,pnVar23);
            return pnVar20;
          }
LAB_00199b98:
          iVar32 = ppVar6->record_level;
          goto joined_r0x00199b9c;
        }
      }
      else {
        if (uVar3 != 0x13c) goto switchD_00199428_caseD_11c;
        pcVar25 = (ptVar8->pos).fname;
        uVar28._0_4_ = (ptVar8->pos).lno;
        uVar28._4_4_ = (ptVar8->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
          if (pnVar22 == &err_struct) {
            return &err_struct;
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            pnVar23 = stmt(c2m_ctx,no_err_p);
            if (pnVar23 == &err_struct) {
              return &err_struct;
            }
            nVar31 = N_WHILE;
            goto LAB_00199a69;
          }
          goto LAB_00199b98;
        }
      }
      goto LAB_00199a73;
    }
    pcVar25 = (ptVar8->pos).fname;
    uVar35._0_4_ = (ptVar8->pos).lno;
    uVar35._4_4_ = (ptVar8->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar22 = new_node(c2m_ctx,N_IGNORE);
    }
    else {
      pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar22 == &err_struct) {
        return &err_struct;
      }
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) {
LAB_00199dac:
        iVar32 = ppVar6->record_level;
joined_r0x00199db0:
        if (iVar32 != 0) {
          return &err_struct;
        }
        iVar32 = 0x3b;
        goto LAB_00199eaf;
      }
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    }
    pnVar20 = new_node2(c2m_ctx,N_RETURN,pnVar20,pnVar22);
LAB_00199b90:
    pVar37.lno = (int)uVar35;
    pVar37.ln_pos = (int)((ulong)uVar35 >> 0x20);
    pVar37.fname = pcVar25;
LAB_00199c3d:
    add_pos(c2m_ctx,pnVar20,pVar37);
    return pnVar20;
  }
  switch(uVar3) {
  case 0x11b:
    pcVar25 = (ptVar8->pos).fname;
    uVar36._0_4_ = (ptVar8->pos).lno;
    uVar36._4_4_ = (ptVar8->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nVar31 = N_BREAK;
LAB_00199845:
      p.lno = (int)uVar36;
      p.ln_pos = (int)((ulong)uVar36 >> 0x20);
      p.fname = pcVar25;
      pnVar20 = new_pos_node1(c2m_ctx,nVar31,p,pnVar20);
      return pnVar20;
    }
    goto LAB_00199861;
  default:
switchD_00199428_caseD_11c:
    if (*(short *)ppVar6->curr_token == 0x3b) {
      pnVar22 = new_node(c2m_ctx,N_IGNORE);
    }
    else {
      pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar22 == &err_struct) {
        return &err_struct;
      }
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pVar37 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar22->uid)
      ;
      pnVar20 = new_node2(c2m_ctx,N_EXPR,pnVar20,pnVar22);
      goto LAB_00199c3d;
    }
LAB_00199c44:
    iVar32 = ppVar6->record_level;
    goto joined_r0x00199c4c;
  case 0x11f:
    pcVar25 = (ptVar8->pos).fname;
    uVar36._0_4_ = (ptVar8->pos).lno;
    uVar36._4_4_ = (ptVar8->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nVar31 = N_CONTINUE;
      goto LAB_00199845;
    }
LAB_00199861:
    iVar32 = ppVar6->record_level;
joined_r0x00199c4c:
    if (iVar32 != 0) goto LAB_00199c66;
    iVar32 = 0x3b;
    break;
  case 0x121:
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar23 = stmt(c2m_ctx,no_err_p);
    if (pnVar23 == &err_struct) {
      return &err_struct;
    }
    ptVar8 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar8 != 0x13c) {
      if (ppVar6->record_level != 0) {
        return &err_struct;
      }
      iVar32 = 0x13c;
      goto LAB_00199eaf;
    }
    pcVar25 = (ptVar8->pos).fname;
    uVar28._0_4_ = (ptVar8->pos).lno;
    uVar28._4_4_ = (ptVar8->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) {
      if (ppVar6->record_level != 0) {
        return &err_struct;
      }
      iVar32 = 0x28;
      goto LAB_00199eaf;
    }
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
    if (pnVar22 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar31 = N_DO;
        goto LAB_00199a69;
      }
LAB_00199e99:
      iVar32 = ppVar6->record_level;
      goto joined_r0x00199db0;
    }
    iVar32 = ppVar6->record_level;
joined_r0x00199b9c:
    if (iVar32 != 0) {
      return &err_struct;
    }
    iVar32 = 0x29;
LAB_00199eaf:
    pcVar25 = get_token_name(c2m_ctx,iVar32);
    syntax_error(c2m_ctx,pcVar25);
    return &err_struct;
  case 0x127:
    pVar37 = ptVar8->pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) goto LAB_00199a73;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar22 = new_node(c2m_ctx,N_FOR);
    add_pos(c2m_ctx,pnVar22,pVar37);
    pnVar22->attr = ppVar6->curr_scope;
    ppVar6->curr_scope = pnVar22;
    sVar21 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
    pnVar23 = declaration(c2m_ctx,1);
    record_stop(c2m_ctx,sVar21,(uint)(pnVar23 == &err_struct));
    ppVar6->curr_scope = (node_t_conflict)pnVar22->attr;
    if (pnVar23 == &err_struct) {
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        pnVar23 = new_node(c2m_ctx,N_IGNORE);
      }
      else {
        pnVar23 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
        if (pnVar23 == &err_struct) {
          return &err_struct;
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) goto LAB_00199dac;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      }
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar24 = new_node(c2m_ctx,N_IGNORE);
    }
    else {
      pnVar24 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar24 == &err_struct) {
        return &err_struct;
      }
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) goto LAB_00199e99;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    }
    if (*(short *)ppVar6->curr_token == 0x29) {
      op = new_node(c2m_ctx,N_IGNORE);
    }
    else {
      op = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (op == &err_struct) {
        return &err_struct;
      }
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      op_00 = stmt(c2m_ctx,no_err_p);
      if (op_00 == &err_struct) {
        return &err_struct;
      }
      op_append(c2m_ctx,pnVar22,pnVar20);
      op_append(c2m_ctx,pnVar22,pnVar23);
      op_append(c2m_ctx,pnVar22,pnVar24);
      op_append(c2m_ctx,pnVar22,op);
      op_append(c2m_ctx,pnVar22,op_00);
      return pnVar22;
    }
    if (ppVar6->record_level != 0) goto LAB_00199c66;
    iVar32 = 0x29;
    break;
  case 0x128:
    pcVar25 = (ptVar8->pos).fname;
    uVar35._0_4_ = (ptVar8->pos).lno;
    uVar35._4_4_ = (ptVar8->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    ptVar8 = c2m_ctx->parse_ctx->curr_token;
    sVar2 = *(short *)ptVar8;
    if (sVar2 == 0x2a) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar22 == &err_struct) {
        return &err_struct;
      }
LAB_00199ac7:
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        pnVar20 = new_node2(c2m_ctx,(sVar2 == 0x2a) + N_GOTO,pnVar20,pnVar22);
        goto LAB_00199b90;
      }
      goto LAB_00199c44;
    }
    if (sVar2 == 0x103) {
      pnVar22 = ptVar8->node;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      goto LAB_00199ac7;
    }
    if (ppVar6->record_level != 0) goto LAB_00199c66;
    pcVar25 = "identifier";
    goto LAB_00199c61;
  case 0x129:
    pVar37 = ptVar8->pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar22 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar22 == &err_struct) {
        return &err_struct;
      }
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        pnVar23 = stmt(c2m_ctx,no_err_p);
        if (pnVar23 == &err_struct) {
          return &err_struct;
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x123) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnVar24 = stmt(c2m_ctx,no_err_p);
          if (pnVar24 == &err_struct) {
            return &err_struct;
          }
        }
        else {
          pnVar24 = new_node(c2m_ctx,N_IGNORE);
        }
        pnVar20 = new_node4(c2m_ctx,N_IF,pnVar20,pnVar22,pnVar23,pnVar24);
        goto LAB_00199c3d;
      }
      goto LAB_00199b98;
    }
LAB_00199a73:
    if (ppVar6->record_level != 0) goto LAB_00199c66;
    iVar32 = 0x28;
  }
  pcVar25 = get_token_name(c2m_ctx,iVar32);
LAB_00199c61:
  syntax_error(c2m_ctx,pcVar25);
LAB_00199c66:
  return &err_struct;
}

Assistant:

D (stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t l, n, op1, op2, op3, r;
  pos_t pos;

  l = new_node (c2m_ctx, N_LIST);
  while ((op1 = TRY (label)) != err_node) {
    op_append (c2m_ctx, l, op1);
  }
  if (C ('{')) {
    P (compound_stmt);
    if (NL_HEAD (l->u.ops) != NULL) { /* replace empty label list */
      assert (NL_HEAD (r->u.ops)->code == N_LIST && NL_HEAD (NL_HEAD (r->u.ops)->u.ops) == NULL);
      NL_REMOVE (r->u.ops, NL_HEAD (r->u.ops));
      NL_PREPEND (r->u.ops, l);
    }
  } else if (MP (T_IF, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    op2 = r;
    if (!M (T_ELSE)) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (stmt);
    }
    r = new_pos_node4 (c2m_ctx, N_IF, pos, l, op1, op2, r);
  } else if (MP (T_SWITCH, pos)) { /* selection-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_SWITCH, pos, l, op1, r);
  } else if (MP (T_WHILE, pos)) { /* iteration-statement */
    PT ('(');
    P (expr);
    op1 = r;
    PT (')');
    P (stmt);
    r = new_pos_node3 (c2m_ctx, N_WHILE, pos, l, op1, r);
  } else if (M (T_DO)) { /* iteration-statement */
    P (stmt);
    op1 = r;
    PTP (T_WHILE, pos);
    PT ('(');
    P (expr);
    PT (')');
    PT (';');
    r = new_pos_node3 (c2m_ctx, N_DO, pos, l, r, op1);
  } else if (MP (T_FOR, pos)) { /* iteration-statement */
    PT ('(');
    n = new_pos_node (c2m_ctx, N_FOR, pos);
    n->attr = curr_scope;
    curr_scope = n;
    if ((r = TRY (declaration)) != err_node) {
      op1 = r;
      curr_scope = n->attr;
    } else {
      curr_scope = n->attr;
      if (!M (';')) {
        P (expr);
        op1 = r;
        PT (';');
      } else {
        op1 = new_node (c2m_ctx, N_IGNORE);
      }
    }
    if (M (';')) {
      op2 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op2 = r;
      PT (';');
    }
    if (C (')')) {
      op3 = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      op3 = r;
    }
    PT (')');
    P (stmt);
    op_append (c2m_ctx, n, l);
    op_append (c2m_ctx, n, op1);
    op_append (c2m_ctx, n, op2);
    op_append (c2m_ctx, n, op3);
    op_append (c2m_ctx, n, r);
    r = n;
  } else if (MP (T_GOTO, pos)) { /* jump-statement */
    int indirect_p = FALSE;
    if (!M ('*')) {
      PTN (T_ID);
    } else {
      indirect_p = TRUE;
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, indirect_p ? N_INDIRECT_GOTO : N_GOTO, pos, l, r);
  } else if (MP (T_CONTINUE, pos)) { /* continue-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_CONTINUE, pos, l);
  } else if (MP (T_BREAK, pos)) { /* break-statement */
    PT (';');
    r = new_pos_node1 (c2m_ctx, N_BREAK, pos, l);
  } else if (MP (T_RETURN, pos)) { /* return-statement */
    if (M (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
      PT (';');
    }
    r = new_pos_node2 (c2m_ctx, N_RETURN, pos, l, r);
  } else { /* expression-statement */
    if (C (';')) {
      r = new_node (c2m_ctx, N_IGNORE);
    } else {
      P (expr);
    }
    PT (';');
    r = new_pos_node2 (c2m_ctx, N_EXPR, POS (r), l, r);
  }
  return r;
}